

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O3

void * cache_alloc(cache *c)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  config_mutex_t *mutex;
  char *pcVar7;
  ulong uVar8;
  
  uVar1 = c->page_size;
  uVar5 = c->entry_size + 1;
  uVar3 = uVar1 / uVar5;
  mutex = &c->mutex;
  pthread_lock_mutex(mutex);
  if (c->page_count != 0) {
    lVar4 = c->entry_size * uVar3;
    sVar6 = 0;
    do {
      if (uVar5 <= uVar1) {
        pcVar7 = c->pages[sVar6];
        uVar8 = 0;
        do {
          if (pcVar7[uVar8 + lVar4] == '\0') {
            pcVar7[uVar8 + lVar4] = '\x01';
            pthread_unlock_mutex(mutex);
            return pcVar7 + uVar8 * c->entry_size;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar3);
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != c->page_count);
  }
  uVar2 = add_page(c);
  if ((int)uVar2 < 0) {
    pthread_unlock_mutex(mutex);
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = c->pages[uVar2];
    pcVar7[c->entry_size * uVar3] = '\x01';
    pthread_unlock_mutex(mutex);
  }
  return pcVar7;
}

Assistant:

void *
cache_alloc( struct cache *c ) {
  size_t i;
  size_t j;
  size_t entries_per_page;
  int new_page;
  char *current_page;
  char *locks;

  entries_per_page = c->page_size / ( c->entry_size + sizeof( char ) );

  config_lock_mutex( &c->mutex );

  for( i = 0; i < c->page_count; i++ ) {
    current_page = c->pages[i];
    locks = current_page + ( entries_per_page * c->entry_size );
    for( j = 0; j < entries_per_page; j++ ) {
      if( locks[j] == 0 ) {
        locks[j] = 1;
        config_unlock_mutex( &c->mutex );
        return current_page + ( j * c->entry_size );
      }
    }
  }

  new_page = add_page( c );
  if( new_page < 0 ) {
    config_unlock_mutex( &c->mutex );
    return NULL;
  }

  current_page = c->pages[new_page];
  locks = current_page + ( entries_per_page * c->entry_size );
  locks[0] = 1;
  config_unlock_mutex( &c->mutex );
  return current_page;
}